

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_0::ComputeShaderGeneratedGroup::init
          (ComputeShaderGeneratedGroup *this,EVP_PKEY_CTX *ctx)

{
  TestSpec *value;
  bool bVar1;
  DrawMethod method;
  TestNode *node;
  TestNode *node_00;
  TestNode *node_01;
  ComputeShaderGeneratedSeparateCase *pCVar2;
  ComputeShaderGeneratedCombinedCase *pCVar3;
  undefined8 extraout_RAX;
  undefined8 uVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  allocator<char> local_239;
  int *local_238;
  ComputeShaderGeneratedGroup *local_230;
  long local_228;
  long local_220;
  TestNode *local_218;
  string desc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  string name;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"separate",
             "Use separate compute shaders for each buffer");
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"combined",
             "Use combined compute shader for all buffers");
  node_01 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_01,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"large",
             "Draw shapes with large buffers");
  tcu::TestNode::addChild((TestNode *)this,node);
  tcu::TestNode::addChild((TestNode *)this,node_00);
  local_218 = node_01;
  tcu::TestNode::addChild((TestNode *)this,node_01);
  pCVar2 = (ComputeShaderGeneratedSeparateCase *)operator_new(0xb8);
  ComputeShaderGeneratedSeparateCase::ComputeShaderGeneratedSeparateCase
            (pCVar2,(this->super_TestCaseGroup).m_context,"drawarrays_compute_cmd",
             "Command from compute shader",DRAWMETHOD_DRAWARRAYS,true,false,false,8,1);
  tcu::TestNode::addChild(node,(TestNode *)pCVar2);
  pCVar2 = (ComputeShaderGeneratedSeparateCase *)operator_new(0xb8);
  ComputeShaderGeneratedSeparateCase::ComputeShaderGeneratedSeparateCase
            (pCVar2,(this->super_TestCaseGroup).m_context,"drawarrays_compute_data",
             "Data from compute shader",DRAWMETHOD_DRAWARRAYS,false,true,false,8,1);
  tcu::TestNode::addChild(node,(TestNode *)pCVar2);
  pCVar2 = (ComputeShaderGeneratedSeparateCase *)operator_new(0xb8);
  ComputeShaderGeneratedSeparateCase::ComputeShaderGeneratedSeparateCase
            (pCVar2,(this->super_TestCaseGroup).m_context,"drawarrays_compute_cmd_and_data",
             "Command and data from compute shader",DRAWMETHOD_DRAWARRAYS,true,true,false,8,1);
  tcu::TestNode::addChild(node,(TestNode *)pCVar2);
  pCVar2 = (ComputeShaderGeneratedSeparateCase *)operator_new(0xb8);
  ComputeShaderGeneratedSeparateCase::ComputeShaderGeneratedSeparateCase
            (pCVar2,(this->super_TestCaseGroup).m_context,"drawelements_compute_cmd",
             "Command from compute shader",DRAWMETHOD_DRAWELEMENTS,true,false,false,8,1);
  tcu::TestNode::addChild(node,(TestNode *)pCVar2);
  pCVar2 = (ComputeShaderGeneratedSeparateCase *)operator_new(0xb8);
  ComputeShaderGeneratedSeparateCase::ComputeShaderGeneratedSeparateCase
            (pCVar2,(this->super_TestCaseGroup).m_context,"drawelements_compute_data",
             "Data from compute shader",DRAWMETHOD_DRAWELEMENTS,false,true,false,8,1);
  tcu::TestNode::addChild(node,(TestNode *)pCVar2);
  pCVar2 = (ComputeShaderGeneratedSeparateCase *)operator_new(0xb8);
  ComputeShaderGeneratedSeparateCase::ComputeShaderGeneratedSeparateCase
            (pCVar2,(this->super_TestCaseGroup).m_context,"drawelements_compute_indices",
             "Indices from compute shader",DRAWMETHOD_DRAWELEMENTS,false,false,true,8,1);
  tcu::TestNode::addChild(node,(TestNode *)pCVar2);
  pCVar2 = (ComputeShaderGeneratedSeparateCase *)operator_new(0xb8);
  ComputeShaderGeneratedSeparateCase::ComputeShaderGeneratedSeparateCase
            (pCVar2,(this->super_TestCaseGroup).m_context,"drawelements_compute_cmd_and_data",
             "Command and data from compute shader",DRAWMETHOD_DRAWELEMENTS,true,true,false,8,1);
  tcu::TestNode::addChild(node,(TestNode *)pCVar2);
  pCVar2 = (ComputeShaderGeneratedSeparateCase *)operator_new(0xb8);
  ComputeShaderGeneratedSeparateCase::ComputeShaderGeneratedSeparateCase
            (pCVar2,(this->super_TestCaseGroup).m_context,"drawelements_compute_cmd_and_indices",
             "Command and indices from compute shader",DRAWMETHOD_DRAWELEMENTS,true,false,true,8,1);
  tcu::TestNode::addChild(node,(TestNode *)pCVar2);
  pCVar2 = (ComputeShaderGeneratedSeparateCase *)operator_new(0xb8);
  ComputeShaderGeneratedSeparateCase::ComputeShaderGeneratedSeparateCase
            (pCVar2,(this->super_TestCaseGroup).m_context,"drawelements_compute_data_and_indices",
             "Data and indices from compute shader",DRAWMETHOD_DRAWELEMENTS,false,true,true,8,1);
  tcu::TestNode::addChild(node,(TestNode *)pCVar2);
  pCVar2 = (ComputeShaderGeneratedSeparateCase *)operator_new(0xb8);
  ComputeShaderGeneratedSeparateCase::ComputeShaderGeneratedSeparateCase
            (pCVar2,(this->super_TestCaseGroup).m_context,
             "drawelements_compute_cmd_and_data_and_indices",
             "Command, data and indices from compute shader",DRAWMETHOD_DRAWELEMENTS,true,true,true,
             8,1);
  tcu::TestNode::addChild(node,(TestNode *)pCVar2);
  pCVar3 = (ComputeShaderGeneratedCombinedCase *)operator_new(0xa8);
  ComputeShaderGeneratedCombinedCase::ComputeShaderGeneratedCombinedCase
            (pCVar3,(this->super_TestCaseGroup).m_context,"drawarrays_compute_cmd_and_data",
             "Command and data from compute shader",DRAWMETHOD_DRAWARRAYS,true,true,false,8,1);
  tcu::TestNode::addChild(node_00,(TestNode *)pCVar3);
  pCVar3 = (ComputeShaderGeneratedCombinedCase *)operator_new(0xa8);
  ComputeShaderGeneratedCombinedCase::ComputeShaderGeneratedCombinedCase
            (pCVar3,(this->super_TestCaseGroup).m_context,"drawelements_compute_cmd_and_data",
             "Command and data from compute shader",DRAWMETHOD_DRAWELEMENTS,true,true,false,8,1);
  tcu::TestNode::addChild(node_00,(TestNode *)pCVar3);
  pCVar3 = (ComputeShaderGeneratedCombinedCase *)operator_new(0xa8);
  ComputeShaderGeneratedCombinedCase::ComputeShaderGeneratedCombinedCase
            (pCVar3,(this->super_TestCaseGroup).m_context,"drawelements_compute_cmd_and_indices",
             "Command and indices from compute shader",DRAWMETHOD_DRAWELEMENTS,true,false,true,8,1);
  tcu::TestNode::addChild(node_00,(TestNode *)pCVar3);
  pCVar3 = (ComputeShaderGeneratedCombinedCase *)operator_new(0xa8);
  ComputeShaderGeneratedCombinedCase::ComputeShaderGeneratedCombinedCase
            (pCVar3,(this->super_TestCaseGroup).m_context,"drawelements_compute_data_and_indices",
             "Data and indices from compute shader",DRAWMETHOD_DRAWELEMENTS,false,true,true,8,1);
  tcu::TestNode::addChild(node_00,(TestNode *)pCVar3);
  pCVar3 = (ComputeShaderGeneratedCombinedCase *)operator_new(0xa8);
  local_230 = this;
  ComputeShaderGeneratedCombinedCase::ComputeShaderGeneratedCombinedCase
            (pCVar3,(this->super_TestCaseGroup).m_context,
             "drawelements_compute_cmd_and_data_and_indices",
             "Command, data and indices from compute shader",DRAWMETHOD_DRAWELEMENTS,true,true,true,
             8,1);
  tcu::TestNode::addChild(node_00,(TestNode *)pCVar3);
  uVar4 = extraout_RAX;
  for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
    local_238 = &init::specs[0].numDrawCommands;
    lVar7 = 0x10;
    local_228 = lVar6;
    while( true ) {
      if (lVar7 == 0) break;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f0,SSBOArrayLengthTests::init::arraysSized + 1,
                 (allocator<char> *)&local_d0);
      method = init::methods[lVar6].method;
      pcVar5 = "drawelements";
      if (method == DRAWMETHOD_DRAWARRAYS) {
        pcVar5 = "drawarrays";
      }
      local_220 = lVar7 + -1;
      std::operator+(&local_170,&local_1f0,pcVar5);
      bVar1 = init::methods[lVar6].separateCompute;
      pcVar5 = "_combined";
      if (bVar1 != false) {
        pcVar5 = "_separate";
      }
      std::operator+(&local_1d0,&local_170,pcVar5);
      std::operator+(&local_70,&local_1d0,"_grid_");
      value = (TestSpec *)(local_238 + -1);
      de::toString<int>(&local_190,(int *)value);
      std::operator+(&local_150,&local_70,&local_190);
      std::operator+(&local_1b0,&local_150,"x");
      de::toString<int>(&local_110,(int *)value);
      std::operator+(&local_130,&local_1b0,&local_110);
      std::operator+(&desc,&local_130,"_drawcount_");
      de::toString<int>(&local_b0,local_238);
      std::operator+(&name,&desc,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&desc);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"Draw grid with ",&local_239);
      pcVar5 = "drawelements indirect";
      if (method == DRAWMETHOD_DRAWARRAYS) {
        pcVar5 = "drawarrays indirect";
      }
      std::operator+(&local_110,&local_b0,pcVar5);
      std::operator+(&local_190,&local_110," calculating buffers in ");
      pcVar5 = "combined";
      if (bVar1 != false) {
        pcVar5 = "separate";
      }
      std::operator+(&local_1f0,&local_190,pcVar5);
      std::operator+(&local_170,&local_1f0," compute shader.");
      std::operator+(&local_1d0,&local_170," Grid size is ");
      de::toString<int>(&local_d0,(int *)value);
      std::operator+(&local_70,&local_1d0,&local_d0);
      std::operator+(&local_150,&local_70,"x");
      de::toString<int>(&local_90,(int *)value);
      std::operator+(&local_1b0,&local_150,&local_90);
      std::operator+(&local_130,&local_1b0,", draw count is ");
      de::toString<int>(&local_50,local_238);
      std::operator+(&desc,&local_130,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_b0);
      if (bVar1 == false) {
        pCVar2 = (ComputeShaderGeneratedSeparateCase *)operator_new(0xa8);
        lVar7 = local_220;
        lVar6 = local_228;
        ComputeShaderGeneratedCombinedCase::ComputeShaderGeneratedCombinedCase
                  ((ComputeShaderGeneratedCombinedCase *)pCVar2,
                   (local_230->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                   desc._M_dataplus._M_p,method,false,true,method == DRAWMETHOD_DRAWELEMENTS,
                   ((TestSpec *)(local_238 + -1))->gridSize,*local_238);
      }
      else {
        pCVar2 = (ComputeShaderGeneratedSeparateCase *)operator_new(0xb8);
        lVar7 = local_220;
        lVar6 = local_228;
        ComputeShaderGeneratedSeparateCase::ComputeShaderGeneratedSeparateCase
                  (pCVar2,(local_230->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                   desc._M_dataplus._M_p,method,false,true,method == DRAWMETHOD_DRAWELEMENTS,
                   ((TestSpec *)(local_238 + -1))->gridSize,*local_238);
      }
      tcu::TestNode::addChild(local_218,(TestNode *)pCVar2);
      std::__cxx11::string::~string((string *)&desc);
      uVar4 = std::__cxx11::string::~string((string *)&name);
      local_238 = local_238 + 2;
    }
  }
  return (int)uVar4;
}

Assistant:

void ComputeShaderGeneratedGroup::init (void)
{
	const int					gridSize		= 8;
	tcu::TestCaseGroup* const	separateGroup	= new tcu::TestCaseGroup(m_testCtx, "separate", "Use separate compute shaders for each buffer");
	tcu::TestCaseGroup* const	combinedGroup	= new tcu::TestCaseGroup(m_testCtx, "combined", "Use combined compute shader for all buffers");
	tcu::TestCaseGroup* const	largeGroup		= new tcu::TestCaseGroup(m_testCtx, "large",   "Draw shapes with large buffers");

	this->addChild(separateGroup);
	this->addChild(combinedGroup);
	this->addChild(largeGroup);

	// .separate
	{
		separateGroup->addChild(new ComputeShaderGeneratedSeparateCase(m_context, "drawarrays_compute_cmd",							"Command from compute shader",						ComputeShaderGeneratedCase::DRAWMETHOD_DRAWARRAYS,		true,	false,	false,	gridSize,	1));
		separateGroup->addChild(new ComputeShaderGeneratedSeparateCase(m_context, "drawarrays_compute_data",						"Data from compute shader",							ComputeShaderGeneratedCase::DRAWMETHOD_DRAWARRAYS,		false,	true,	false,	gridSize,	1));
		separateGroup->addChild(new ComputeShaderGeneratedSeparateCase(m_context, "drawarrays_compute_cmd_and_data",				"Command and data from compute shader",				ComputeShaderGeneratedCase::DRAWMETHOD_DRAWARRAYS,		true,	true,	false,	gridSize,	1));

		separateGroup->addChild(new ComputeShaderGeneratedSeparateCase(m_context, "drawelements_compute_cmd",						"Command from compute shader",						ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS,	true,	false,	false,	gridSize,	1));
		separateGroup->addChild(new ComputeShaderGeneratedSeparateCase(m_context, "drawelements_compute_data",						"Data from compute shader",							ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS,	false,	true,	false,	gridSize,	1));
		separateGroup->addChild(new ComputeShaderGeneratedSeparateCase(m_context, "drawelements_compute_indices",					"Indices from compute shader",						ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS,	false,	false,	true,	gridSize,	1));
		separateGroup->addChild(new ComputeShaderGeneratedSeparateCase(m_context, "drawelements_compute_cmd_and_data",				"Command and data from compute shader",				ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS,	true,	true,	false,	gridSize,	1));
		separateGroup->addChild(new ComputeShaderGeneratedSeparateCase(m_context, "drawelements_compute_cmd_and_indices",			"Command and indices from compute shader",			ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS,	true,	false,	true,	gridSize,	1));
		separateGroup->addChild(new ComputeShaderGeneratedSeparateCase(m_context, "drawelements_compute_data_and_indices",			"Data and indices from compute shader",				ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS,	false,	true,	true,	gridSize,	1));
		separateGroup->addChild(new ComputeShaderGeneratedSeparateCase(m_context, "drawelements_compute_cmd_and_data_and_indices",	"Command, data and indices from compute shader",	ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS,	true,	true,	true,	gridSize,	1));
	}

	// .combined
	{
		combinedGroup->addChild(new ComputeShaderGeneratedCombinedCase(m_context, "drawarrays_compute_cmd_and_data",				"Command and data from compute shader",				ComputeShaderGeneratedCase::DRAWMETHOD_DRAWARRAYS,		true,	true,	false,	gridSize,	1));
		combinedGroup->addChild(new ComputeShaderGeneratedCombinedCase(m_context, "drawelements_compute_cmd_and_data",				"Command and data from compute shader",				ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS,	true,	true,	false,	gridSize,	1));
		combinedGroup->addChild(new ComputeShaderGeneratedCombinedCase(m_context, "drawelements_compute_cmd_and_indices",			"Command and indices from compute shader",			ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS,	true,	false,	true,	gridSize,	1));
		combinedGroup->addChild(new ComputeShaderGeneratedCombinedCase(m_context, "drawelements_compute_data_and_indices",			"Data and indices from compute shader",				ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS,	false,	true,	true,	gridSize,	1));
		combinedGroup->addChild(new ComputeShaderGeneratedCombinedCase(m_context, "drawelements_compute_cmd_and_data_and_indices",	"Command, data and indices from compute shader",	ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS,	true,	true,	true,	gridSize,	1));
	}

	// .large
	{
		struct TestSpec
		{
			int gridSize;
			int numDrawCommands;
		};
		struct TestMethod
		{
			ComputeShaderGeneratedCase::DrawMethod method;
			bool                                   separateCompute;
		};

		static const TestSpec specs[] =
		{
			{ 100,	1 },		// !< drawArrays array size ~ 1.9 MB
			{ 200,	1 },		// !< drawArrays array size ~ 7.7 MB
			{ 500,	1 },		// !< drawArrays array size ~ 48 MB
			{ 1000,	1 },		// !< drawArrays array size ~ 192 MB
			{ 1200,	1 },		// !< drawArrays array size ~ 277 MB
			{ 1500,	1 },		// !< drawArrays array size ~ 430 MB

			{ 100,	8 },		// !< drawArrays array size ~ 1.9 MB
			{ 200,	8 },		// !< drawArrays array size ~ 7.7 MB
			{ 500,	8 },		// !< drawArrays array size ~ 48 MB
			{ 1000,	8 },		// !< drawArrays array size ~ 192 MB
			{ 1200,	8 },		// !< drawArrays array size ~ 277 MB
			{ 1500,	8 },		// !< drawArrays array size ~ 430 MB

			{ 100,	200  },		// !< 50 cells per draw call
			{ 200,	800  },		// !< 50 cells per draw call
			{ 500,	2500 },		// !< 100 cells per draw call
			{ 1000,	5000 },		// !< 250 cells per draw call
		};
		static const TestMethod methods[] =
		{
			{ ComputeShaderGeneratedCase::DRAWMETHOD_DRAWARRAYS,	true	},
			{ ComputeShaderGeneratedCase::DRAWMETHOD_DRAWARRAYS,	false	},
			{ ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS,	true	},
			{ ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS,	false	},
		};

		for (int methodNdx = 0; methodNdx < DE_LENGTH_OF_ARRAY(methods); ++methodNdx)
		for (int specNdx = 0; specNdx < DE_LENGTH_OF_ARRAY(specs); ++specNdx)
		{
			const std::string name = std::string("")
									+ ((methods[methodNdx].method == ComputeShaderGeneratedCase::DRAWMETHOD_DRAWARRAYS) ? ("drawarrays") : ("drawelements"))
									+ ((methods[methodNdx].separateCompute) ? ("_separate") : ("_combined"))
									+ "_grid_" + de::toString(specs[specNdx].gridSize) + "x" + de::toString(specs[specNdx].gridSize)
									+ "_drawcount_" + de::toString(specs[specNdx].numDrawCommands);

			const std::string desc = std::string("Draw grid with ")
									+ ((methods[methodNdx].method == ComputeShaderGeneratedCase::DRAWMETHOD_DRAWARRAYS) ? ("drawarrays indirect") : ("drawelements indirect"))
									+ " calculating buffers in " + ((methods[methodNdx].separateCompute) ? ("separate") : ("combined")) + " compute shader."
									+ " Grid size is " + de::toString(specs[specNdx].gridSize) + "x" + de::toString(specs[specNdx].gridSize)
									+ ", draw count is "  + de::toString(specs[specNdx].numDrawCommands);

			const bool computeIndices = (methods[methodNdx].method == ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS);

			if (methods[methodNdx].separateCompute)
				largeGroup->addChild(new ComputeShaderGeneratedSeparateCase(m_context, name.c_str(), desc.c_str(), methods[methodNdx].method, false, true, computeIndices, specs[specNdx].gridSize, specs[specNdx].numDrawCommands));
			else
				largeGroup->addChild(new ComputeShaderGeneratedCombinedCase(m_context, name.c_str(), desc.c_str(), methods[methodNdx].method, false, true, computeIndices, specs[specNdx].gridSize, specs[specNdx].numDrawCommands));
		}
	}
}